

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed-solomon.c
# Opt level: O2

void correct_reed_solomon_debug_print(correct_reed_solomon *rs)

{
  byte bVar1;
  uint i_1;
  uint uVar2;
  uint i;
  ulong uVar3;
  bool bVar4;
  polynomial_t poly;
  
  for (uVar3 = 0; uVar3 != 0x100; uVar3 = uVar3 + 1) {
    printf("%3d  %3d    %3d  %3d\n",uVar3 & 0xffffffff,(ulong)(rs->field).exp[uVar3],
           uVar3 & 0xffffffff,(ulong)(rs->field).log[uVar3]);
  }
  putchar(10);
  printf("roots: ");
  for (uVar2 = 0; uVar3 = (ulong)uVar2, uVar3 < rs->min_distance; uVar2 = uVar2 + 1) {
    printf("%d",(ulong)rs->generator_roots[uVar3]);
    if (uVar3 < rs->min_distance - 1) {
      printf(", ");
    }
  }
  puts("\n");
  printf("generator: ");
  for (uVar3 = 0; uVar3 < (rs->generator).order + 1; uVar3 = uVar3 + 1) {
    printf("%d*x^%d",(ulong)(rs->generator).coeff[uVar3],uVar3 & 0xffffffff);
    if (uVar3 < (rs->generator).order) {
      printf(" + ");
    }
  }
  puts("\n");
  printf("generator (alpha format): ");
  uVar3 = (ulong)((rs->generator).order + 1) - 1;
  while (uVar3 != 0xffffffffffffffff) {
    printf("alpha^%d*x^%d",(ulong)(rs->field).log[(rs->generator).coeff[uVar3 & 0xffffffff]],
           uVar3 & 0xffffffff);
    bVar4 = uVar3 != 0;
    uVar3 = uVar3 - 1;
    if (bVar4) {
      printf(" + ");
    }
  }
  puts("\n");
  bVar4 = false;
  printf("remainder: ");
  for (uVar3 = 0; uVar3 < (rs->encoded_remainder).order + 1; uVar3 = uVar3 + 1) {
    bVar1 = (rs->encoded_remainder).coeff[uVar3];
    if (bVar1 != 0) {
      if (bVar4) {
        printf(" + ");
        bVar1 = (rs->encoded_remainder).coeff[uVar3];
      }
      printf("%d*x^%d",(ulong)bVar1,uVar3 & 0xffffffff);
      bVar4 = true;
    }
  }
  puts("\n");
  printf("syndromes: ");
  for (uVar2 = 0; uVar3 = (ulong)uVar2, uVar3 < rs->min_distance; uVar2 = uVar2 + 1) {
    printf("%d",(ulong)rs->syndromes[uVar3]);
    if (uVar3 < rs->min_distance - 1) {
      printf(", ");
    }
  }
  puts("\n");
  bVar4 = false;
  printf("numerrors: %d\n\n",(ulong)(rs->error_locator).order);
  printf("error locator: ");
  for (uVar3 = 0; uVar3 < (rs->error_locator).order + 1; uVar3 = uVar3 + 1) {
    bVar1 = (rs->error_locator).coeff[uVar3];
    if (bVar1 != 0) {
      if (bVar4) {
        printf(" + ");
        bVar1 = (rs->error_locator).coeff[uVar3];
      }
      printf("%d*x^%d",(ulong)bVar1,uVar3 & 0xffffffff);
      bVar4 = true;
    }
  }
  puts("\n");
  printf("error roots: ");
  for (uVar3 = 0; uVar2 = (rs->error_locator).order, uVar3 < uVar2; uVar3 = uVar3 + 1) {
    poly.order = uVar2;
    poly.coeff = (rs->error_locator).coeff;
    poly._12_4_ = 0;
    bVar1 = polynomial_eval(rs->field,poly,rs->error_roots[uVar3]);
    printf("%d@%d",(ulong)bVar1,(ulong)rs->error_roots[uVar3]);
    if (uVar3 < (rs->error_locator).order - 1) {
      printf(", ");
    }
  }
  puts("\n");
  bVar4 = false;
  printf("error evaluator: ");
  for (uVar3 = 0; uVar3 < (rs->error_evaluator).order; uVar3 = uVar3 + 1) {
    bVar1 = (rs->error_evaluator).coeff[uVar3];
    if (bVar1 != 0) {
      if (bVar4) {
        printf(" + ");
        bVar1 = (rs->error_evaluator).coeff[uVar3];
      }
      printf("%d*x^%d",(ulong)bVar1,uVar3 & 0xffffffff);
      bVar4 = true;
    }
  }
  puts("\n");
  bVar4 = false;
  printf("error locator derivative: ");
  for (uVar3 = 0; uVar3 < (rs->error_locator_derivative).order; uVar3 = uVar3 + 1) {
    bVar1 = (rs->error_locator_derivative).coeff[uVar3];
    if (bVar1 != 0) {
      if (bVar4) {
        printf(" + ");
        bVar1 = (rs->error_locator_derivative).coeff[uVar3];
      }
      printf("%d*x^%d",(ulong)bVar1,uVar3 & 0xffffffff);
      bVar4 = true;
    }
  }
  puts("\n");
  printf("error locator: ");
  for (uVar3 = 0; uVar3 < (rs->error_locator).order; uVar3 = uVar3 + 1) {
    printf("%d@%d",(ulong)rs->error_vals[uVar3],(ulong)rs->error_locations[uVar3]);
    if (uVar3 < (rs->error_locator).order - 1) {
      printf(", ");
    }
  }
  puts("\n");
  return;
}

Assistant:

void correct_reed_solomon_debug_print(correct_reed_solomon *rs) {
    for (unsigned int i = 0; i < 256; i++) {
        printf("%3d  %3d    %3d  %3d\n", i, rs->field.exp[i], i, rs->field.log[i]);
    }
    printf("\n");

    printf("roots: ");
    for (unsigned int i = 0; i < rs->min_distance; i++) {
        printf("%d", rs->generator_roots[i]);
        if (i < rs->min_distance - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("generator: ");
    for (unsigned int i = 0; i < rs->generator.order + 1; i++) {
        printf("%d*x^%d", rs->generator.coeff[i], i);
        if (i < rs->generator.order) {
            printf(" + ");
        }
    }
    printf("\n\n");

    printf("generator (alpha format): ");
    for (unsigned int i = rs->generator.order + 1; i > 0; i--) {
        printf("alpha^%d*x^%d", rs->field.log[rs->generator.coeff[i - 1]], i - 1);
        if (i > 1) {
            printf(" + ");
        }
    }
    printf("\n\n");

    printf("remainder: ");
    bool has_printed = false;
    for (unsigned int i = 0; i < rs->encoded_remainder.order + 1; i++) {
        if (!rs->encoded_remainder.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->encoded_remainder.coeff[i], i);
    }
    printf("\n\n");

    printf("syndromes: ");
    for (unsigned int i = 0; i < rs->min_distance; i++) {
        printf("%d", rs->syndromes[i]);
        if (i < rs->min_distance - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("numerrors: %d\n\n", rs->error_locator.order);

    printf("error locator: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_locator.order + 1; i++) {
        if (!rs->error_locator.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_locator.coeff[i], i);
    }
    printf("\n\n");

    printf("error roots: ");
    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        printf("%d@%d", polynomial_eval(rs->field, rs->error_locator, rs->error_roots[i]), rs->error_roots[i]);
        if (i < rs->error_locator.order - 1) {
            printf(", ");
        }
    }
    printf("\n\n");

    printf("error evaluator: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_evaluator.order; i++) {
        if (!rs->error_evaluator.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_evaluator.coeff[i], i);
    }
    printf("\n\n");

    printf("error locator derivative: ");
    has_printed = false;
    for (unsigned int i = 0; i < rs->error_locator_derivative.order; i++) {
        if (!rs->error_locator_derivative.coeff[i]) {
            continue;
        }
        if (has_printed) {
            printf(" + ");
        }
        has_printed = true;
        printf("%d*x^%d", rs->error_locator_derivative.coeff[i], i);
    }
    printf("\n\n");

    printf("error locator: ");
    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        printf("%d@%d", rs->error_vals[i], rs->error_locations[i]);
        if (i < rs->error_locator.order - 1) {
            printf(", ");
        }
    }
    printf("\n\n");
}